

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_outlets.h
# Opt level: O2

void __thiscall c74::max::t_mock_outlet::t_mock_outlet(t_mock_outlet *this,void *x,char *type)

{
  long lVar1;
  
  this->m_owner = x;
  this->m_id = 0;
  (this->m_messages).
  super__Vector_base<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).
  super__Vector_base<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_messages).
           super__Vector_base<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_messages).
           super__Vector_base<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>,_std::allocator<std::vector<c74::max::t_atom,_std::allocator<c74::max::t_atom>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  if (type != (char *)0x0) {
    strncpy(this->m_type,type,0x100);
  }
  lVar1 = (long)m_id_counter;
  m_id_counter = (int)(lVar1 + 1);
  this->m_id = lVar1 + 1;
  return;
}

Assistant:

t_mock_outlet(void *x, const char *type):
    m_owner(x), m_id(0)
    {
        m_type[0] = 0;
        if (type)
            strncpy(m_type, type, 256);
        m_id_counter++;
        m_id = m_id_counter;
    }